

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O1

bool __thiscall RTIMUMPU9250::setSampleRate(RTIMUMPU9250 *this,int rate)

{
  uint uVar1;
  ulong uVar2;
  
  if (rate - 5U < 0x7cfc) {
    uVar1 = 8000;
    if (23999 < rate - 8000U) {
      uVar1 = rate;
    }
    uVar2 = 1000;
    if (6999 < uVar1 - 1000) {
      uVar2 = (ulong)uVar1;
    }
    uVar1 = (uint)uVar2;
    if ((int)uVar1 < 1000) {
      uVar1 = (uint)(1000 / (1000 / uVar2));
    }
    (this->super_RTIMU).m_sampleRate = uVar1;
    (this->super_RTIMU).m_sampleInterval = 1000000 / (ulong)uVar1;
  }
  else {
    fprintf(_stderr,"Illegal sample rate %d\n");
  }
  return rate - 5U < 0x7cfc;
}

Assistant:

bool RTIMUMPU9250::setSampleRate(int rate)
{
    if ((rate < MPU9250_SAMPLERATE_MIN) || (rate > MPU9250_SAMPLERATE_MAX)) {
        HAL_ERROR1("Illegal sample rate %d\n", rate);
        return false;
    }

    //  Note: rates interact with the lpf settings

    if ((rate < MPU9250_SAMPLERATE_MAX) && (rate >= 8000))
        rate = 8000;

    if ((rate < 8000) && (rate >= 1000))
        rate = 1000;

    if (rate < 1000) {
        int sampleDiv = (1000 / rate) - 1;
        m_sampleRate = 1000 / (1 + sampleDiv);
    } else {
        m_sampleRate = rate;
    }
    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;
    return true;
}